

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::ReleasePages(LargeHeapBlock *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  char *local_58;
  DWORD local_44;
  BOOL ret;
  DWORD oldProtect;
  void *addr;
  size_t guardPageCount;
  size_t realPageCount;
  char *blockStartAddress;
  IdleDecommitPageAllocator *pageAllocator;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  pageAllocator = (IdleDecommitPageAllocator *)recycler;
  recycler_local = (Recycler *)this;
  if ((this->super_HeapBlock).segment == (Segment *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x158,"(segment != nullptr)","segment != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  blockStartAddress = (char *)HeapInfo::GetRecyclerLargeBlockPageAllocator(this->heapInfo);
  realPageCount = (size_t)(this->super_HeapBlock).address;
  guardPageCount = this->pageCount;
  bVar2 = InPageHeapMode(this);
  if (bVar2) {
    addr = (void *)((ulong)this->pageHeapData->actualPageCount - this->pageCount);
    guardPageCount = (size_t)this->pageHeapData->actualPageCount;
    if ((this->pageHeapData->isGuardPageDecommitted & 1U) == 0) {
      BVar3 = VirtualProtect(this->pageHeapData->guardPageAddress,(long)addr * 0x1000,4,&local_44);
      if ((BVar3 == 0) || (local_44 != 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x17e,"(ret && oldProtect == 0x01)","ret && oldProtect == PAGE_NOACCESS"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
    else {
      _ret = (char *)0x0;
      bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ::IsPageReuseDisabled
                        ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                          *)blockStartAddress);
      if (!bVar2) {
        _ret = (char *)VirtualAlloc(this->pageHeapData->guardPageAddress,(long)addr << 0xc,0x1000,4)
        ;
      }
      if ((_ret != this->pageHeapData->guardPageAddress) ||
         (bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                  ::IsPageReuseDisabled
                            ((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                              *)blockStartAddress), bVar2)) {
        VirtualFree(this->pageHeapData->objectPageAddr,this->pageCount << 0xc,0x4000);
        (this->super_HeapBlock).segment = (Segment *)0x0;
        return;
      }
    }
    if (this->pageHeapData->pageHeapMode == PageHeapModeBlockStart) {
      local_58 = this->pageHeapData->guardPageAddress;
    }
    else {
      local_58 = this->pageHeapData->objectPageAddr;
    }
    realPageCount = (size_t)local_58;
  }
  if (realPageCount != 0) {
    memset((void *)realPageCount,0xfe,guardPageCount << 0xc);
  }
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::Release((PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             *)blockStartAddress,(void *)realPageCount,guardPageCount,
            (this->super_HeapBlock).segment);
  (this->super_HeapBlock).segment = (Segment *)0x0;
  return;
}

Assistant:

void
LargeHeapBlock::ReleasePages(Recycler * recycler)
{
    Assert(segment != nullptr);

    IdleDecommitPageAllocator* pageAllocator = heapInfo->GetRecyclerLargeBlockPageAllocator();
    char* blockStartAddress = this->address;
    size_t realPageCount = this->pageCount;
#ifdef RECYCLER_PAGE_HEAP
    if (InPageHeapMode())
    {
        size_t guardPageCount = pageHeapData->actualPageCount - this->pageCount;
        realPageCount = pageHeapData->actualPageCount;

        if (pageHeapData->isGuardPageDecommitted)
        {
            void* addr = nullptr;
#ifdef RECYCLER_NO_PAGE_REUSE
            if (!pageAllocator->IsPageReuseDisabled())
#endif
            {
                addr = VirtualAlloc(pageHeapData->guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, MEM_COMMIT, PAGE_READWRITE);
            }

            if (addr != pageHeapData->guardPageAddress // failed to re-commit guard page
#ifdef RECYCLER_NO_PAGE_REUSE
                || pageAllocator->IsPageReuseDisabled()
#endif
                )
            {
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
                VirtualFree((char*)pageHeapData->objectPageAddr, this->pageCount* AutoSystemInfo::PageSize, MEM_DECOMMIT);
                RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockPageSize, pageCount * AutoSystemInfo::PageSize);
                this->segment = nullptr;
                return;
            }
        }
        else
        {
            DWORD oldProtect;
            BOOL ret = ::VirtualProtect(pageHeapData->guardPageAddress, AutoSystemInfo::PageSize * guardPageCount, PAGE_READWRITE, &oldProtect);
            Assert(ret && oldProtect == PAGE_NOACCESS);
        }

        blockStartAddress = pageHeapData->pageHeapMode == PageHeapMode::PageHeapModeBlockStart ?
            pageHeapData->guardPageAddress : pageHeapData->objectPageAddr;

    }
#endif

#ifdef RECYCLER_FREE_MEM_FILL
    if(blockStartAddress != nullptr)
    {
        memset(blockStartAddress, DbgMemFill, AutoSystemInfo::PageSize * realPageCount);
    }
#endif
    pageAllocator->Release(blockStartAddress, realPageCount, segment);
    RECYCLER_PERF_COUNTER_SUB(LargeHeapBlockPageSize, pageCount * AutoSystemInfo::PageSize);
    this->segment = nullptr;
}